

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_constructor_helper
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool is_move)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  bool bVar4;
  bool move;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  t_cpp_generator *this_00;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  pointer pptVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string tmp_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"other","");
  t_generator::tmp(&local_90,(t_generator *)this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,*(char **)CONCAT44(extraout_var,iVar5),
                      ((undefined8 *)CONCAT44(extraout_var,iVar5))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"::",2);
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,*(char **)CONCAT44(extraout_var_00,iVar5),
             ((undefined8 *)CONCAT44(extraout_var_00,iVar5))[1]);
  if (is_move) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
    iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,*(char **)CONCAT44(extraout_var_01,iVar5),
                        ((undefined8 *)CONCAT44(extraout_var_01,iVar5))[1]);
    lVar9 = 3;
    pcVar3 = " && ";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,"(const ",7);
    iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,*(char **)CONCAT44(extraout_var_02,iVar5),
                        ((undefined8 *)CONCAT44(extraout_var_02,iVar5))[1]);
    lVar9 = 2;
    pcVar3 = " & ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3 + 1,lVar9);
  this_00 = (t_cpp_generator *)
            std::__ostream_insert<char,std::char_traits<char>>
                      (out,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") ",2);
  if (!is_move) {
    bVar4 = is_struct_storage_not_throwing(this_00,tstruct);
    if (!bVar4) goto LAB_001868c8;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"noexcept ",9);
LAB_001868c8:
  if (is_exception) {
    std::__ostream_insert<char,std::char_traits<char>>(out,": TException() ",0xf);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(void) ",7);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  pptVar10 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar10 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar2 = &local_d0.field_2;
    bVar4 = false;
    do {
      if ((*pptVar10)->req_ != T_REQUIRED) {
        bVar4 = true;
      }
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,((*pptVar10)->name_)._M_dataplus._M_p,
                          ((*pptVar10)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      std::__cxx11::string::append((char *)local_70);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_70,(ulong)((*pptVar10)->name_)._M_dataplus._M_p);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_d0.field_2._M_allocated_capacity = *psVar8;
        local_d0.field_2._8_8_ = plVar7[3];
        local_d0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar8;
        local_d0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (is_move) {
        move = is_complex_type(this,(*pptVar10)->type_);
      }
      else {
        move = false;
      }
      anon_unknown.dwarf_223c96::maybeMove(&local_b0,&local_d0,move);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      pptVar10 = pptVar10 + 1;
    } while (pptVar10 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (bVar4) {
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"__isset = ",10);
      local_d0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      std::__cxx11::string::append((char *)&local_d0);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_d0._M_dataplus._M_p,
                 local_d0._M_dataplus._M_p + local_d0._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_constructor_helper(ostream& out,
                                                  t_struct* tstruct,
                                                  bool is_exception,
                                                  bool is_move) {

  std::string tmp_name = tmp("other");

  indent(out) << tstruct->get_name() << "::" << tstruct->get_name();

  if (is_move) {
    out << "(" << tstruct->get_name() << "&& ";
  } else {
    out << "(const " << tstruct->get_name() << "& ";
  }
  out << tmp_name << ") ";
  if(is_move || is_struct_storage_not_throwing(tstruct))
    out << "noexcept ";
  if (is_exception)
    out << ": TException() ";
  out << "{" << endl;
  indent_up();

  const vector<t_field*>& members = tstruct->get_members();

  // eliminate compiler unused warning
  if (members.empty())
    indent(out) << "(void) " << tmp_name << ";" << endl;

  vector<t_field*>::const_iterator f_iter;
  bool has_nonrequired_fields = false;
  for (f_iter = members.begin(); f_iter != members.end(); ++f_iter) {
    if ((*f_iter)->get_req() != t_field::T_REQUIRED)
      has_nonrequired_fields = true;
    indent(out) << (*f_iter)->get_name() << " = "
                << maybeMove(
                    tmp_name + "." + (*f_iter)->get_name(), 
                    is_move && is_complex_type((*f_iter)->get_type()))
                << ";" << endl;
  }

  if (has_nonrequired_fields) {
    indent(out) << "__isset = " << maybeMove(tmp_name + ".__isset", false) << ";" << endl;
  }

  indent_down();
  indent(out) << "}" << endl;
}